

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDA.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  typed_value<unsigned_int,_char> *ptVar2;
  typed_value<double,_char> *ptVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  options_description *poVar5;
  basic_command_line_parser<char> *pbVar6;
  size_type sVar7;
  ostream *poVar8;
  variable_value *pvVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  uint *puVar11;
  double *pdVar12;
  VariationalBayesEstimatorOnLDA *pVVar13;
  bool bVar14;
  string local_a90 [32];
  string local_a70 [32];
  string local_a50 [32];
  string local_a30 [32];
  string local_a10 [32];
  string local_9f0 [32];
  VariationalBayesEstimatorOnLDA *local_9d0;
  VariationalBayesEstimatorOnLDA *estimator;
  string local_9a8 [32];
  undefined1 local_988 [8];
  BOWFileParser parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670 [39];
  allocator local_649;
  string local_648 [39];
  allocator local_621;
  string local_620 [39];
  allocator local_5f9;
  string local_5f8 [39];
  allocator local_5d1;
  string local_5d0 [39];
  allocator local_5a9;
  string local_5a8 [39];
  allocator local_581;
  string local_580 [39];
  allocator local_559;
  string local_558 [37];
  byte local_533;
  byte local_532;
  allocator local_531;
  string local_530 [39];
  allocator local_509;
  string local_508 [32];
  string local_4e8 [8];
  string wordListFilename;
  string local_4c8 [8];
  string VLBTimeSeriesFilename;
  string local_4a8 [8];
  string VLBFilename;
  string local_488 [8];
  string betaFilename;
  string local_468 [8];
  string alphaFilename;
  string local_448 [8];
  string phiFilename;
  string local_428 [8];
  string thetaFilename;
  string local_408 [8];
  string outputDirectory;
  double local_3e8;
  double convergenceDiterminationRate;
  string local_3d8 [4];
  uint K;
  string BOWFilename;
  basic_command_line_parser<char> local_3b8;
  basic_parsed_options<char> local_340;
  variables_map local_318 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_308 [144];
  options_description local_278 [8];
  options_description cmdline_options;
  undefined8 local_1f8;
  allocator local_1e9;
  string local_1e8 [32];
  options_description local_1c8 [8];
  options_description hidden;
  positional_options_description local_148 [8];
  positional_options_description pd;
  allocator local_109;
  string local_108 [32];
  double local_e8;
  uint local_dc;
  undefined8 local_d8 [3];
  allocator local_b9;
  string local_b8 [32];
  options_description local_98 [8];
  options_description opt;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Options",&local_b9);
  boost::program_options::options_description::options_description
            (local_98,local_b8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_d8[0] = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d8,"help,h");
  ptVar2 = boost::program_options::value<unsigned_int>();
  local_dc = 10;
  ptVar2 = boost::program_options::typed_value<unsigned_int,_char>::default_value(ptVar2,&local_dc);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"nmtp,k",(char *)ptVar2);
  ptVar3 = boost::program_options::value<double>();
  local_e8 = 0.001;
  ptVar3 = boost::program_options::typed_value<double,_char>::default_value(ptVar3,&local_e8);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"cdrt,d",(char *)ptVar3);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"./",&local_109);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_108);
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"otpt,o",(char *)ptVar4);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  boost::program_options::positional_options_description::positional_options_description(local_148);
  boost::program_options::positional_options_description::add((char *)local_148,0x12c38c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"hidden",&local_1e9);
  boost::program_options::options_description::options_description
            (local_1c8,local_1e8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  local_1f8 = boost::program_options::options_description::add_options();
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  boost::program_options::options_description_easy_init::operator()
            ((char *)&local_1f8,(value_semantic *)0x12c38c,(char *)ptVar4);
  boost::program_options::options_description::options_description
            (local_278,(uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  poVar5 = (options_description *)boost::program_options::options_description::add(local_278);
  boost::program_options::options_description::add(poVar5);
  boost::program_options::variables_map::variables_map(local_318);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (&local_3b8,argc,argv);
  pbVar6 = boost::program_options::basic_command_line_parser<char>::options(&local_3b8,local_278);
  pbVar6 = boost::program_options::basic_command_line_parser<char>::positional(pbVar6,local_148);
  boost::program_options::basic_command_line_parser<char>::run(&local_340,pbVar6);
  boost::program_options::store((basic_parsed_options *)&local_340,local_318,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_340);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser(&local_3b8);
  boost::program_options::notify(local_318);
  std::__cxx11::string::string(local_3d8);
  std::__cxx11::string::string(local_408);
  std::__cxx11::string::string(local_428);
  std::__cxx11::string::string(local_448);
  std::__cxx11::string::string(local_468);
  std::__cxx11::string::string(local_488);
  std::__cxx11::string::string(local_4a8);
  std::__cxx11::string::string(local_4c8);
  std::__cxx11::string::string(local_4e8);
  std::allocator<char>::allocator();
  local_532 = 0;
  local_533 = 0;
  std::__cxx11::string::string(local_508,"help",&local_509);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_308,(key_type *)local_508);
  bVar14 = true;
  if (sVar7 == 0) {
    std::allocator<char>::allocator();
    local_532 = 1;
    std::__cxx11::string::string(local_530,"BOWfile",&local_531);
    local_533 = 1;
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_308,(key_type *)local_530);
    bVar14 = sVar7 == 0;
  }
  if ((local_533 & 1) != 0) {
    std::__cxx11::string::~string(local_530);
  }
  if ((local_532 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
  }
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  if (bVar14) {
    poVar8 = std::operator<<((ostream *)&std::cout,"Usage:\n LDA [BOW file] [-options] ");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar8 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_98);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_558,"BOWfile",&local_559);
  pvVar9 = boost::program_options::variables_map::operator[](local_318,(string *)local_558);
  pbVar10 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar9);
  std::__cxx11::string::operator=(local_3d8,(string *)pbVar10);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"nmtp",&local_581);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_308,(key_type *)local_580);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  if (sVar7 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5a8,"nmtp",&local_5a9);
    pvVar9 = boost::program_options::variables_map::operator[](local_318,(string *)local_5a8);
    puVar11 = boost::program_options::variable_value::as<unsigned_int>(pvVar9);
    convergenceDiterminationRate._4_4_ = *puVar11;
    std::__cxx11::string::~string(local_5a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d0,"cdrt",&local_5d1);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_308,(key_type *)local_5d0);
  std::__cxx11::string::~string(local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  if (sVar7 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5f8,"cdrt",&local_5f9);
    pvVar9 = boost::program_options::variables_map::operator[](local_318,(string *)local_5f8);
    pdVar12 = boost::program_options::variable_value::as<double>(pvVar9);
    local_3e8 = *pdVar12;
    std::__cxx11::string::~string(local_5f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_620,"otpt",&local_621);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_308,(key_type *)local_620);
  std::__cxx11::string::~string(local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  if (sVar7 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_648,"otpt",&local_649);
    pvVar9 = boost::program_options::variables_map::operator[](local_318,(string *)local_648);
    pbVar10 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar9);
    std::__cxx11::string::operator=(local_408,(string *)pbVar10);
    std::__cxx11::string::~string(local_648);
    std::allocator<char>::~allocator((allocator<char> *)&local_649);
  }
  std::__cxx11::string::size();
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_408);
  if (*pcVar1 != '/') {
    std::__cxx11::string::push_back((char)local_408);
  }
  std::operator+(local_670,(char *)local_408);
  std::__cxx11::string::operator=(local_428,(string *)local_670);
  std::__cxx11::string::~string((string *)local_670);
  std::operator+(local_690,(char *)local_408);
  std::__cxx11::string::operator=(local_448,(string *)local_690);
  std::__cxx11::string::~string((string *)local_690);
  std::operator+(local_6b0,(char *)local_408);
  std::__cxx11::string::operator=(local_468,(string *)local_6b0);
  std::__cxx11::string::~string((string *)local_6b0);
  std::operator+(local_6d0,(char *)local_408);
  std::__cxx11::string::operator=(local_488,(string *)local_6d0);
  std::__cxx11::string::~string((string *)local_6d0);
  std::operator+(local_6f0,(char *)local_408);
  std::__cxx11::string::operator=(local_4a8,(string *)local_6f0);
  std::__cxx11::string::~string((string *)local_6f0);
  std::operator+(local_710,(char *)local_408);
  std::__cxx11::string::operator=(local_4c8,(string *)local_710);
  std::__cxx11::string::~string((string *)local_710);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &parser._docVoca.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(char *)local_408);
  std::__cxx11::string::operator=
            (local_4e8,
             (string *)
             &parser._docVoca.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &parser._docVoca.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string(local_9a8,local_3d8);
  BOWFileParser::BOWFileParser((BOWFileParser *)local_988,(string *)local_9a8);
  std::__cxx11::string::~string(local_9a8);
  std::__cxx11::string::string((string *)&estimator,local_4e8);
  BOWFileParser::writeWordList((BOWFileParser *)local_988,(string *)&estimator);
  std::__cxx11::string::~string((string *)&estimator);
  pVVar13 = (VariationalBayesEstimatorOnLDA *)operator_new(0x168);
  VariationalBayesEstimatorOnLDA::VariationalBayesEstimatorOnLDA
            (pVVar13,(BOWFileParser *)local_988,convergenceDiterminationRate._4_4_,local_3e8);
  local_9d0 = pVVar13;
  (*pVVar13->_vptr_VariationalBayesEstimatorOnLDA[0xd])();
  pVVar13 = local_9d0;
  std::__cxx11::string::string(local_9f0,local_428);
  std::__cxx11::string::string(local_a10,local_448);
  std::__cxx11::string::string(local_a30,local_468);
  std::__cxx11::string::string(local_a50,local_488);
  (*pVVar13->_vptr_VariationalBayesEstimatorOnLDA[0xb])
            (pVVar13,local_9f0,local_a10,local_a30,local_a50);
  std::__cxx11::string::~string(local_a50);
  std::__cxx11::string::~string(local_a30);
  std::__cxx11::string::~string(local_a10);
  std::__cxx11::string::~string(local_9f0);
  pVVar13 = local_9d0;
  std::__cxx11::string::string(local_a70,local_4a8);
  std::__cxx11::string::string(local_a90,local_4c8);
  (*pVVar13->_vptr_VariationalBayesEstimatorOnLDA[0xc])(pVVar13,local_a70,local_a90);
  std::__cxx11::string::~string(local_a90);
  std::__cxx11::string::~string(local_a70);
  if (local_9d0 != (VariationalBayesEstimatorOnLDA *)0x0) {
    (*local_9d0->_vptr_VariationalBayesEstimatorOnLDA[1])();
  }
  BOWFileParser::~BOWFileParser((BOWFileParser *)local_988);
  std::__cxx11::string::~string(local_4e8);
  std::__cxx11::string::~string(local_4c8);
  std::__cxx11::string::~string(local_4a8);
  std::__cxx11::string::~string(local_488);
  std::__cxx11::string::~string(local_468);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::~string(local_428);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string(local_3d8);
  boost::program_options::variables_map::~variables_map(local_318);
  boost::program_options::options_description::~options_description(local_278);
  boost::program_options::options_description::~options_description(local_1c8);
  boost::program_options::positional_options_description::~positional_options_description(local_148)
  ;
  boost::program_options::options_description::~options_description(local_98);
  return 0;
}

Assistant:

int main(int argc, char *argv[]){

    //Options{{{
    boost::program_options::options_description opt("Options");
    opt.add_options()
    ("help,h", "show help")
    ("nmtp,k", boost::program_options::value<unsigned int>()->default_value(10), "number of topics")
    ("cdrt,d", boost::program_options::value<double>()->default_value(0.001), "convergence ditermination rate")
    ("otpt,o", boost::program_options::value<string>()->default_value("./"), "directory name for output")
    ;

    boost::program_options::positional_options_description pd;
    pd.add("BOWfile", 1);

    boost::program_options::options_description hidden("hidden");
    hidden.add_options()
        ("BOWfile", boost::program_options::value<string>(), "hidden")
        ;
    boost::program_options::options_description cmdline_options;
    cmdline_options.add(opt).add(hidden);

    boost::program_options::variables_map vm;
    try{
        boost::program_options::store(boost::program_options::command_line_parser(argc, argv).options(cmdline_options).positional(pd).run(), vm);
    // }catch(const boost::program_options::error_with_option_name& e){
    //     cout<<e.what()<<endl;
    }catch(...){
        cout<<"Option error."<<endl;
    }
    boost::program_options::notify(vm);
    string BOWFilename;
    unsigned int K;
    double convergenceDiterminationRate;
    string outputDirectory;
    string thetaFilename;
    string phiFilename;
    string alphaFilename;
    string betaFilename;
    string VLBFilename;
    string VLBTimeSeriesFilename;
    string wordListFilename;
    if (vm.count("help") || !vm.count("BOWfile")){
        cout<<"Usage:\n LDA [BOW file] [-options] "<<endl;
        cout<<endl;
        cout<<opt<<endl;
        exit(1);
    }else{
        BOWFilename = vm["BOWfile"].as<std::string>();
        if(vm.count("nmtp"))K = vm["nmtp"].as<unsigned int>();
        if(vm.count("cdrt"))convergenceDiterminationRate = vm["cdrt"].as<double>();
        if(vm.count("otpt"))outputDirectory = vm["otpt"].as<std::string>();
        if(outputDirectory[outputDirectory.size()-1] != '/')outputDirectory.push_back('/');
        thetaFilename = outputDirectory + "theta.csv";
        phiFilename = outputDirectory + "phi.csv";
        alphaFilename = outputDirectory + "alpha.csv";
        betaFilename = outputDirectory + "beta.csv";
        VLBFilename = outputDirectory + "variationalLowerBound.csv";
        VLBTimeSeriesFilename = outputDirectory + "VLBTimeSeries.csv";
        wordListFilename = outputDirectory + "wordList.csv";
    }

    BOWFileParser parser(BOWFilename);
    parser.writeWordList(wordListFilename);
    //}}}

//estimation{{{
    VariationalBayesEstimatorOnLDA *estimator;
    estimator = new VariationalBayesEstimatorOnLDA(parser, K, convergenceDiterminationRate);
    estimator->runIteraions();
    estimator->writeParameter(thetaFilename, phiFilename, alphaFilename, betaFilename);
    estimator->writeVariationalLowerBound(VLBFilename, VLBTimeSeriesFilename);
    delete estimator;
//}}}
    return 0;
}